

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O3

void __thiscall
sznet::net::KcpWithTcpClient::handleTcpMessage
          (KcpWithTcpClient *this,TcpConnectionPtr *tcpConn,string *message,Timestamp param_3)

{
  InetAddress *this_00;
  KcpConnectionPtr *this_01;
  EventLoop *pEVar1;
  pointer pcVar2;
  pointer len;
  element_type *peVar3;
  _Tuple_impl<0UL,_sznet::net::InetAddress_*,_std::default_delete<sznet::net::InetAddress>_> _Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  sz_sock fd;
  KcpConnection *this_02;
  _Tuple_impl<0UL,_sznet::net::InetAddress_*,_std::default_delete<sznet::net::InetAddress>_> _Var9;
  uint16_t port;
  undefined1 auVar10 [8];
  undefined1 auVar11 [8];
  uint32_t id;
  undefined4 uVar12;
  SourceFile file;
  undefined1 local_1088 [8];
  char buf [256];
  char *local_d8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  undefined1 local_90 [8];
  Buffer recvBuf;
  string connName;
  
  pEVar1 = this->m_loop;
  bVar8 = EventLoop::isInLoopThread(pEVar1);
  if (!bVar8) {
    EventLoop::abortNotInLoopThread(pEVar1);
  }
  if (message->_M_string_length != 10) {
    file._8_8_ = 0x14;
    file.m_data = "KcpWithTcpClient.cpp";
    Logger::Logger((Logger *)local_1088,file,0xd4,ERROR);
    if (0x35 < (uint)((int)&stack0xffffffffffffff28 - (int)local_d8)) {
      builtin_strncpy(local_d8,"KcpWithTcpClient::handleTcpMessage recv size error - ",0x35);
      local_d8 = local_d8 + 0x35;
    }
    LogStream::operator<<((LogStream *)buf,message->_M_string_length);
    Logger::~Logger((Logger *)local_1088);
    return;
  }
  Buffer::Buffer((Buffer *)local_90,4,0x400);
  pcVar2 = (message->_M_dataplus)._M_p;
  len = (pointer)message->_M_string_length;
  Buffer::ensureWritableBytes((Buffer *)local_90,(size_t)len);
  memcpy((void *)(recvBuf.m_nCheapPrepend + recvBuf.m_readerIndex),pcVar2,(size_t)len);
  if (recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start + (-recvBuf.m_nCheapPrepend - recvBuf.m_readerIndex) < len) {
    __assert_fail("len <= writableBytes()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                  ,0xd4,"void sznet::net::Buffer::hasWritten(size_t)");
  }
  recvBuf.m_readerIndex = (size_t)(len + recvBuf.m_readerIndex);
  if (1 < recvBuf.m_readerIndex -
          (long)recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    port = swap_bytes(*(undefined2 *)
                       (recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + recvBuf.m_nCheapPrepend));
    auVar10 = local_90;
    auVar11 = local_90;
    if (recvBuf.m_readerIndex -
        (long)recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != 2) {
      auVar10 = (undefined1  [8])recvBuf.m_readerIndex;
      auVar11 = (undefined1  [8])
                (recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 2);
    }
    recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)auVar11;
    recvBuf.m_readerIndex = (size_t)auVar10;
    if (3 < (ulong)((long)auVar10 - (long)auVar11)) {
      id = swap_bytes(*(undefined4 *)((long)auVar11 + recvBuf.m_nCheapPrepend));
      if ((long)auVar10 - (long)auVar11 == 4) {
        recvBuf.m_readerIndex = (size_t)local_90;
        recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_90;
      }
      else {
        recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)((long)auVar11 + 4);
      }
      if (3 < recvBuf.m_readerIndex -
              (long)recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        uVar12 = swap_bytes(*(undefined4 *)
                             (recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage +
                             recvBuf.m_nCheapPrepend));
        if (recvBuf.m_readerIndex -
            (long)recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == 4) {
          recvBuf.m_readerIndex = (size_t)local_90;
        }
        else {
          local_90 = (undefined1  [8])
                     (recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 4);
        }
        this_00 = &this->m_udpListenAddr;
        recvBuf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_90;
        InetAddress::resetPort(this_00,port,false);
        connName.field_2._12_4_ = uVar12;
        InetAddress::toIpPort_abi_cxx11_((string *)&recvBuf.m_wrapSize,this_00);
        snprintf(local_1088,0x100,":kcp-%s#%d",recvBuf.m_wrapSize,
                 (ulong)((tcpConn->
                         super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->m_id);
        if ((size_type *)recvBuf.m_wrapSize != &connName._M_string_length) {
          operator_delete((void *)recvBuf.m_wrapSize);
        }
        recvBuf.m_wrapSize = (size_t)&connName._M_string_length;
        pcVar2 = (this->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&recvBuf.m_wrapSize,pcVar2,pcVar2 + (this->m_name)._M_string_length);
        std::__cxx11::string::append((char *)&recvBuf.m_wrapSize);
        this_02 = (KcpConnection *)operator_new(0x1f0);
        pEVar1 = this->m_loop;
        fd = sockets::sz_udp_create((uint)(this->m_udpListenAddr).field_0.m_addr.sin_family);
        KcpConnection::KcpConnection
                  (this_02,pEVar1,fd,connName.field_2._12_4_,(string *)&recvBuf.m_wrapSize,id,true,
                   this->m_kcpMode);
        this_01 = &this->m_kcpConnection;
        std::__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>::
        reset<sznet::net::KcpConnection>
                  (&this_01->
                    super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>,
                   this_02);
        peVar3 = (this_01->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        peVar3->m_state = kConnecting;
        _Var9.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl =
             (_Head_base<0UL,_sznet::net::InetAddress_*,_false>)operator_new(0x1c);
        uVar5 = *(undefined8 *)&this_00->field_0;
        uVar6 = *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 8);
        uVar7 = *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0x14);
        *(undefined8 *)
         ((long)_Var9.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl + 0xc) =
             *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0xc);
        *(undefined8 *)
         ((long)_Var9.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl + 0x14) =
             uVar7;
        *(undefined8 *)_Var9.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl =
             uVar5;
        *(undefined8 *)
         ((long)_Var9.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl + 8) =
             uVar6;
        _Var4.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl =
             (peVar3->m_peerAddr)._M_t.
             super___uniq_ptr_impl<sznet::net::InetAddress,_std::default_delete<sznet::net::InetAddress>_>
             ._M_t.
             super__Tuple_impl<0UL,_sznet::net::InetAddress_*,_std::default_delete<sznet::net::InetAddress>_>
             .super__Head_base<0UL,_sznet::net::InetAddress_*,_false>;
        (peVar3->m_peerAddr)._M_t.
        super___uniq_ptr_impl<sznet::net::InetAddress,_std::default_delete<sznet::net::InetAddress>_>
        ._M_t.
        super__Tuple_impl<0UL,_sznet::net::InetAddress_*,_std::default_delete<sznet::net::InetAddress>_>
        .super__Head_base<0UL,_sznet::net::InetAddress_*,_false> =
             _Var9.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl;
        if (_Var4.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>._M_head_impl !=
            (InetAddress *)0x0) {
          operator_delete((void *)_Var4.super__Head_base<0UL,_sznet::net::InetAddress_*,_false>.
                                  _M_head_impl);
        }
        KcpConnection::newKCP
                  ((this_01->
                   super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  );
        std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator=
                  (&((this->m_kcpConnection).
                     super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_kcpConnectionCallback,&this->m_kcpConnectionCallback);
        std::
        function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
        ::operator=(&((this->m_kcpConnection).
                      super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_kcpMessageCallback,&this->m_kcpMessageCallback);
        std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator=
                  (&((this->m_kcpConnection).
                     super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_kcpWriteCompleteCallback,&this->m_kcpWriteCompleteCallback);
        peVar3 = (this_01->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        local_b0._8_8_ = 0;
        local_b0._M_unused._M_object = operator_new(0x18);
        *(code **)local_b0._M_unused._0_8_ = removeKcpConnection;
        *(undefined8 *)((long)local_b0._M_unused._0_8_ + 8) = 0;
        local_98 = std::
                   _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int),_std::_Bind<void_(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>))(const_std::shared_ptr<sznet::net::KcpConnection>_&)>_>
                   ::_M_invoke;
        *(KcpWithTcpClient **)((long)local_b0._M_unused._0_8_ + 0x10) = this;
        local_a0 = std::
                   _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int),_std::_Bind<void_(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>))(const_std::shared_ptr<sznet::net::KcpConnection>_&)>_>
                   ::_M_manager;
        std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>::operator=
                  (&peVar3->m_kcpCloseCallback,
                   (function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)> *)
                   &local_b0);
        if (local_a0 != (code *)0x0) {
          (*local_a0)(&local_b0,&local_b0,__destroy_functor);
        }
        KcpConnection::udpSendHandShakeVerify
                  ((this_01->
                   super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  );
        KcpConnection::udpSendHandShakeTimer
                  ((this_01->
                   super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  );
        if ((size_type *)recvBuf.m_wrapSize != &connName._M_string_length) {
          operator_delete((void *)recvBuf.m_wrapSize);
        }
        if (recvBuf.m_nCheapPrepend == 0) {
          return;
        }
        operator_delete((void *)recvBuf.m_nCheapPrepend);
        return;
      }
    }
    __assert_fail("readableBytes() >= sizeof(int32_t)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                  ,0x11b,"int32_t sznet::net::Buffer::peekInt32() const");
  }
  __assert_fail("readableBytes() >= sizeof(int16_t)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                ,0x123,"int16_t sznet::net::Buffer::peekInt16() const");
}

Assistant:

void KcpWithTcpClient::handleTcpMessage(const TcpConnectionPtr& tcpConn, const string& message, Timestamp)
{
	m_loop->assertInLoopThread();
	if (message.size() != (sizeof(uint16_t) + sizeof(int32_t) + sizeof(int32_t)))
	{
		LOG_ERROR << "KcpWithTcpClient::handleTcpMessage recv size error - " << message.size();
		return;
	}
	Buffer recvBuf;
	recvBuf.append(reinterpret_cast<const void*>(message.data()), message.size());
	// ����������Ϣ
	uint16_t udpListenPort = static_cast<uint16_t>(recvBuf.readInt16());
	uint32_t conv = static_cast<uint32_t>(recvBuf.readInt32());
	int secretId = recvBuf.readInt32();
	m_udpListenAddr.resetPort(udpListenPort);
	// ����KcpConnection
	char buf[256];
	snprintf(buf, sizeof(buf), ":kcp-%s#%d", m_udpListenAddr.toIpPort().c_str(), tcpConn->id());
	string connName = m_name + buf;
	m_kcpConnection.reset(new KcpConnection(m_loop, sockets::sz_udp_create(m_udpListenAddr.family()), secretId, connName, conv, true, m_kcpMode));
	m_kcpConnection->setState(KcpConnection::StateE::kConnecting);
	m_kcpConnection->setPeerAddr(m_udpListenAddr);
	m_kcpConnection->newKCP();
	m_kcpConnection->setKcpConnectionCallback(m_kcpConnectionCallback);
	m_kcpConnection->setKcpMessageCallback(m_kcpMessageCallback);
	m_kcpConnection->setKcpWriteCompleteCallback(m_kcpWriteCompleteCallback);
	m_kcpConnection->setKcpCloseCallback(std::bind(&KcpWithTcpClient::removeKcpConnection, this, std::placeholders::_1));
	m_kcpConnection->udpSendHandShakeVerify();
	m_kcpConnection->udpSendHandShakeTimer();
}